

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O0

void __thiscall
ScalarEstimator::ScalarEstimator
          (ScalarEstimator *this,Property *estimate,StochasticProcess *src,Time *time)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  Time *local_28;
  Time *time_local;
  StochasticProcess *src_local;
  Property *estimate_local;
  ScalarEstimator *this_local;
  
  local_28 = time;
  time_local = (Time *)src;
  src_local = (StochasticProcess *)estimate;
  estimate_local = (Property *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Estimator",&local_81);
  Estimator::Estimator(&this->super_Estimator,src,time,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ScalarEstimator_00190cc0;
  (this->super_Estimator).nEstimate = *(Property *)&(src_local->super_Parametric)._vptr_Parametric;
  (this->super_Estimator).nSamples = 0;
  this->aDist = (double *)0x0;
  this->nDist = 0;
  if (((this->super_Estimator).nEstimate & 2U) != 0) {
    this->nDist = 100;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->nDist;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pdVar3 = (double *)operator_new__(uVar2);
    this->aDist = pdVar3;
    this->aDistRange[0] = -5.0;
    this->aDistRange[1] = 5.0;
    this->dDistOffset = this->aDistRange[0];
    this->dDistScale = (this->aDistRange[1] - this->aDistRange[0]) / (double)this->nDist;
  }
  (*(this->super_Estimator).super_Parametric._vptr_Parametric[4])();
  return;
}

Assistant:

ScalarEstimator::ScalarEstimator(const Property& estimate, StochasticProcess *src, Time *time)
: Estimator(src, time)
{
	nEstimate = estimate;
	nSamples = 0;
	aDist = 0;
	nDist = 0;
	if(nEstimate & EST_DENS) {
		nDist = 100;
		aDist = new double[nDist];
		aDistRange[0] = -5.0;
		aDistRange[1] = 5.0;
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	}
	init();
}